

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

void __thiscall sptk::reaper::EpochTracker::GetVoiceTransitionFeatures(EpochTracker *this)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar4 = (uint)((this->time_span_ * 0.5) / this->internal_frame_interval_ + 0.5);
  uVar7 = 1;
  if (1 < (int)uVar4) {
    uVar7 = uVar4;
  }
  std::vector<float,_std::allocator<float>_>::resize
            (&this->voice_onset_prob_,(long)this->n_feature_frames_);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->voice_offset_prob_,(long)this->n_feature_frames_);
  iVar5 = this->n_feature_frames_;
  uVar6 = (ulong)uVar7;
  if ((int)uVar7 < (int)(iVar5 - uVar7)) {
    pfVar1 = (this->bandpassed_rms_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (this->voice_onset_prob_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (this->voice_offset_prob_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    fVar10 = 1.0;
    do {
      fVar12 = (pfVar1[uVar6 * 2 + lVar9] - pfVar1[lVar9]) / this->level_change_den_;
      fVar11 = fVar10;
      if ((fVar12 <= 1.0) && (fVar11 = fVar12, fVar12 < -1.0)) {
        fVar11 = -1.0;
      }
      fVar12 = fVar10;
      if ((fVar11 <= 1.0) && (fVar12 = fVar11, fVar11 < 0.0)) {
        fVar12 = 0.0;
      }
      fVar13 = fVar10;
      if (-1.0 <= fVar11) {
        if (fVar11 <= 0.0) {
          fVar13 = -fVar11;
        }
        else {
          fVar13 = 0.0;
        }
      }
      pfVar2[uVar6 + lVar9] = fVar12;
      pfVar3[uVar6 + lVar9] = fVar13;
      lVar9 = lVar9 + 1;
    } while ((iVar5 - uVar7) - uVar6 != lVar9);
  }
  pfVar1 = (this->voice_offset_prob_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->voice_onset_prob_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  do {
    iVar5 = iVar5 + -1;
    pfVar1[uVar8] = 0.0;
    pfVar2[uVar8] = 0.0;
    pfVar1[iVar5] = 0.0;
    pfVar2[iVar5] = 0.0;
    uVar8 = uVar8 + 1;
  } while (uVar6 != uVar8);
  return;
}

Assistant:

void EpochTracker::GetVoiceTransitionFeatures(void) {
  int32_t frame_offset = RoundUp(0.5 * time_span_ / internal_frame_interval_);
  if (frame_offset <= 0) {
    frame_offset = 1;
  }
  voice_onset_prob_.resize(n_feature_frames_);
  voice_offset_prob_.resize(n_feature_frames_);
  int32_t limit = n_feature_frames_ - frame_offset;
  for (int32_t frame = frame_offset; frame < limit; ++frame) {
    float delta_rms = (bandpassed_rms_[frame + frame_offset] -
                       bandpassed_rms_[frame - frame_offset]) / level_change_den_;
    if (delta_rms > 1.0) {
      delta_rms = 1.0;
    } else {
      if (delta_rms < -1.0) {
        delta_rms = -1.0;
      }
    }
    float prob_onset = delta_rms;
    float prob_offset = -prob_onset;
    if (prob_onset > 1.0) {
      prob_onset = 1.0;
    } else {
      if (prob_onset < 0.0) {
        prob_onset = 0.0;
      }
    }
    if (prob_offset > 1.0) {
      prob_offset = 1.0;
    } else {
      if (prob_offset < 0.0) {
        prob_offset = 0.0;
      }
    }
    voice_onset_prob_[frame] = prob_onset;
    voice_offset_prob_[frame] = prob_offset;
  }
  // Just set the onset and offset probs to zero in the end zones.
  for (int32_t frame = 0; frame < frame_offset; ++frame) {
    int32_t bframe = n_feature_frames_ - 1 - frame;
    voice_onset_prob_[frame] = voice_offset_prob_[frame] = 0.0;
    voice_onset_prob_[bframe] = voice_offset_prob_[bframe] = 0.0;
  }
}